

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# periodictable.cpp
# Opt level: O0

ostream * indigox::operator<<(ostream *s,Element_p *e)

{
  ostream *poVar1;
  ostream *in_RDI;
  Element *in_stack_00000158;
  string local_30 [48];
  
  std::__shared_ptr_access<indigox::Element,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<indigox::Element,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x124a1a);
  Element::ToString_abi_cxx11_(in_stack_00000158);
  poVar1 = std::operator<<(in_RDI,local_30);
  std::__cxx11::string::~string(local_30);
  return poVar1;
}

Assistant:

std::ostream& operator<<(std::ostream& s, ix::Element_p e) {
    return (s << e->ToString());
  }